

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

int __thiscall CDesign::Initialize(CDesign *this,char *pName)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iY_00;
  uint iX1_00;
  uint iY1_00;
  uint iLayer;
  uint iX2_00;
  uint iY2_00;
  uint uVar6;
  FILE *pFVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  CLayer *pCVar11;
  longlong lVar12;
  CLayer *this_00;
  CNet *pCVar13;
  size_type sVar14;
  reference ppCVar15;
  CPoint *pCVar16;
  ulong uVar17;
  CWire *pCVar18;
  CPoint *pCVar19;
  CBoundary *this_01;
  bool bVar20;
  Tree TVar21;
  CDesign *in_stack_fffffffffffff400;
  int local_bf8;
  int local_be0;
  int local_bd8;
  int local_bb4;
  int local_bac;
  int local_ba4;
  int local_b98;
  int local_b88;
  int local_b3c;
  int local_b34;
  int local_b2c;
  int local_b20;
  int local_b10;
  int local_a1c;
  int local_9f4;
  FILE *pDumpFile;
  int iBlockage;
  CBoundary *pBoundary;
  int iZ2;
  int iY2_2;
  int iX2_2;
  int iZ1;
  int iY1_2;
  int iX1_2;
  int i_2;
  int iNumBlock;
  int iZ_2;
  CPin *pPin2_1;
  CPin *pPin1_1;
  int iY2_1;
  int iX2_1;
  int iY1_1;
  int iX1_1;
  CWire *pWire_1;
  int j_5;
  int iNumWire_1;
  int iNetIndex_1;
  char *pName_1;
  int iZ_1;
  CPin *pPin2;
  CPin *pPin1;
  int iY2;
  int iX2;
  int iY1;
  int iX1;
  CWire *pWire;
  int local_930;
  int iNeighbor_1;
  int j_4;
  int iNeighbor;
  int j_3;
  int iNumWire;
  int local_900;
  Tree FluteTree;
  int j_2;
  CPin *pCurPin;
  CPoint *pCStack_8d8;
  int k;
  CPin *pPin;
  int iZ;
  int iY;
  int iX;
  int iRY;
  int iRX;
  int j_1;
  vector<CPin_*,_std::allocator<CPin_*>_> PinList;
  int j;
  CNet *pNet;
  char *pToken_1;
  uint local_870;
  int iWidth;
  int iNumPin;
  int iNetID;
  char cNetName [512];
  int local_660;
  int i_1;
  int iNetIndex;
  int iDirection;
  CLayer *pLayer;
  int i;
  int iIndex_4;
  int iIndex_3;
  int iIndex_2;
  int iCapacity_1;
  int iIndex_1;
  int iCapacity;
  int iIndex;
  char *pToken;
  char cCmd [512];
  FILE *pTree_File;
  FILE *pInput_File;
  char cLine [512];
  char cName [512];
  char *pName_local;
  CDesign *this_local;
  
  ReadParam(this,pName);
  if (CObject::m_pLog != (FILE *)0x0) {
    fclose((FILE *)CObject::m_pLog);
    CObject::m_pLog = (FILE *)0x0;
  }
  sprintf(cLine + 0x1f8,"%s.log",&this->field_0x234);
  CObject::m_pLog = (FILE *)fopen(cLine + 0x1f8,"wt");
  CObject::m_pDesign = this;
  CObject::Display(0,"input file [%s]\n",&this->field_0x234);
  CObject::Display(0,"tree file [%s]\n",&this->field_0x434);
  pFVar7 = fopen(&this->field_0x234,"rt");
  cCmd._504_8_ = fopen(&this->field_0x434,"rt");
  if ((FILE *)cCmd._504_8_ == (FILE *)0x0) {
    CObject::Display(0,"tree file will be written as ");
    sVar8 = strlen(&this->field_0x434);
    if (sVar8 == 0) {
      sprintf(&this->field_0x434,"%s.stt",&this->field_0x234);
    }
    CObject::Display(5,"%s",&this->field_0x434);
    cCmd._504_8_ = fopen(&this->field_0x434,"wt");
    readLUT();
    CObject::Display(0,"building steiner tree by *pure flute\n");
  }
  else {
    this->IsLUTup = 1;
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                do {
                  pcVar9 = fgets((char *)&pInput_File,0x200,pFVar7);
                  if (pcVar9 == (char *)0x0) goto LAB_001093e3;
                } while (((char)pInput_File == '#') ||
                        (sVar8 = strlen((char *)&pInput_File), sVar8 < 2));
                pcVar9 = strtok((char *)&pInput_File," \t\n");
                iVar1 = strcasecmp(pcVar9,"grid");
                if (iVar1 != 0) break;
                pcVar9 = strtok((char *)0x0," \t\n");
                iVar1 = atoi(pcVar9);
                this->m_iSizeX = iVar1;
                pcVar9 = strtok((char *)0x0," \t\n");
                iVar1 = atoi(pcVar9);
                this->m_iSizeY = iVar1;
                pcVar9 = strtok((char *)0x0," \t\n");
                if (pcVar9 == (char *)0x0) {
                  this->m_iSizeZ = 2;
                }
                else {
                  iVar1 = atoi(pcVar9);
                  if (iVar1 < 2) {
                    local_9f4 = 2;
                  }
                  else {
                    local_9f4 = atoi(pcVar9);
                  }
                  this->m_iSizeZ = local_9f4;
                }
                CBBox::Initialize(&this->super_CBBox,0,0,0,this->m_iSizeX,this->m_iSizeY,
                                  this->m_iSizeZ);
                CreateLayer(this);
              }
              iVar1 = strcasecmp(pcVar9,"vertical");
              if ((iVar1 != 0) || (pcVar10 = strtok((char *)0x0," \t\n"), pcVar10 == (char *)0x0))
              break;
              iIndex_1 = 1;
              _iCapacity = strtok((char *)0x0," \t\n");
              while (_iCapacity != (char *)0x0) {
                iVar1 = atoi(_iCapacity);
                if (iVar1 != 0) {
                  while( true ) {
                    pCVar11 = GetLayer(this,iIndex_1);
                    lVar12 = CObject::GetKey(&pCVar11->super_CObject);
                    if (lVar12 == 0) break;
                    iIndex_1 = iIndex_1 + 1;
                  }
                  pCVar11 = GetLayer(this,iIndex_1);
                  in_stack_fffffffffffff400 = this;
                  CLayer::Configure(pCVar11,iIndex_1,iVar1,10,0,0,0,this);
                }
                iIndex_1 = iIndex_1 + 1;
                _iCapacity = strtok((char *)0x0," \t\n");
              }
            }
            iVar1 = strcasecmp(pcVar9,"horizontal");
            if ((iVar1 != 0) || (pcVar10 = strtok((char *)0x0," \t\n"), pcVar10 == (char *)0x0))
            break;
            iIndex_2 = 1;
            _iCapacity = strtok((char *)0x0," \t\n");
            while (_iCapacity != (char *)0x0) {
              iVar1 = atoi(_iCapacity);
              if (iVar1 != 0) {
                while( true ) {
                  pCVar11 = GetLayer(this,iIndex_2);
                  lVar12 = CObject::GetKey(&pCVar11->super_CObject);
                  if (lVar12 == 0) break;
                  iIndex_2 = iIndex_2 + 1;
                }
                pCVar11 = GetLayer(this,iIndex_2);
                in_stack_fffffffffffff400 = this;
                CLayer::Configure(pCVar11,iIndex_2,iVar1,5,0,0,0,this);
              }
              iIndex_2 = iIndex_2 + 1;
              _iCapacity = strtok((char *)0x0," \t\n");
            }
          }
          iVar1 = strcasecmp(pcVar9,"minimum");
          if (iVar1 != 0) break;
          pcVar9 = strtok((char *)0x0," \t\n");
          iVar1 = strcasecmp(pcVar9,"width");
          if (iVar1 == 0) {
            iIndex_4 = 1;
            _iCapacity = strtok((char *)0x0," \t\n");
            while (_iCapacity != (char *)0x0) {
              pCVar11 = GetLayer(this,iIndex_4);
              iVar1 = atoi(_iCapacity);
              in_stack_fffffffffffff400 = this;
              CLayer::Configure(pCVar11,-1,-1,-1,iVar1,-1,-1,this);
              _iCapacity = strtok((char *)0x0," \t\n");
              iIndex_4 = iIndex_4 + 1;
            }
          }
          else {
            iVar1 = strcasecmp(pcVar9,"spacing");
            if (iVar1 == 0) {
              i = 1;
              _iCapacity = strtok((char *)0x0," \t\n");
              while (_iCapacity != (char *)0x0) {
                pCVar11 = GetLayer(this,i);
                iVar1 = atoi(_iCapacity);
                in_stack_fffffffffffff400 = this;
                CLayer::Configure(pCVar11,-1,-1,-1,-1,iVar1,-1,this);
                _iCapacity = strtok((char *)0x0," \t\n");
                i = i + 1;
              }
            }
          }
        }
        iVar1 = strcasecmp(pcVar9,"via");
        if (iVar1 != 0) break;
        pcVar9 = strtok((char *)0x0," \t\n");
        iVar1 = strcasecmp(pcVar9,"spacing");
        if (iVar1 == 0) {
          pLayer._4_4_ = 1;
          _iCapacity = strtok((char *)0x0," \t\n");
          while (_iCapacity != (char *)0x0) {
            pCVar11 = GetLayer(this,pLayer._4_4_);
            iVar1 = atoi(_iCapacity);
            in_stack_fffffffffffff400 = this;
            CLayer::Configure(pCVar11,-1,-1,-1,-1,-1,iVar1,this);
            _iCapacity = strtok((char *)0x0," \t\n");
            pLayer._4_4_ = pLayer._4_4_ + 1;
          }
        }
      }
      iVar1 = strcasecmp(pcVar9,"num");
      if (iVar1 == 0) break;
      iVar1 = atoi(pcVar9);
      this->m_iLowX = iVar1;
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar1 = atoi(pcVar9);
      this->m_iLowY = iVar1;
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar1 = atoi(pcVar9);
      this->m_iGridX = iVar1;
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar1 = atoi(pcVar9);
      this->m_iGridY = iVar1;
    }
    pcVar9 = strtok((char *)0x0," \t\n");
    iVar1 = strcasecmp(pcVar9,"net");
  } while (iVar1 != 0);
  pcVar9 = strtok((char *)0x0," \t\n");
  iVar1 = atoi(pcVar9);
  CreateNet(this,iVar1);
  for (pLayer._0_4_ = 1; iVar1 = CBBox::T(&this->super_CBBox), (int)pLayer <= iVar1;
      pLayer._0_4_ = (int)pLayer + 1) {
    pCVar11 = GetLayer(this,(int)pLayer);
    lVar12 = CObject::GetKey(&pCVar11->super_CObject);
    if (lVar12 == 0) {
      if ((int)pLayer == 1) {
        i_1 = 10;
      }
      else {
        this_00 = GetLayer(this,(int)pLayer + -1);
        iVar1 = CLayer::GetDirection(this_00);
        if (iVar1 == 10) {
          i_1 = 5;
        }
        else {
          i_1 = 10;
        }
      }
      in_stack_fffffffffffff400 = this;
      CLayer::Configure(pCVar11,(int)pLayer,0,i_1,0,0,0,this);
    }
    (*(pCVar11->super_CObject)._vptr_CObject[3])();
    iVar1 = this->m_iMaxCapacity;
    iVar2 = CLayer::GetCapacity(pCVar11,0x40);
    if (iVar2 < iVar1) {
      local_a1c = this->m_iMaxCapacity;
    }
    else {
      local_a1c = CLayer::GetCapacity(pCVar11,0x40);
    }
    this->m_iMaxCapacity = local_a1c;
  }
  iVar1 = CBBox::T(&this->super_CBBox);
  SetHighestRoutableLayer(this,iVar1);
  SetLowestRoutableLayer(this,1);
LAB_001093e3:
  uVar3 = GetCapacity(this,0x1000);
  CObject::Display(0,"total available capacity: %d\n",(ulong)uVar3);
  iVar1 = GetMemory();
  CObject::Display(0,"reading nets started (%.1f MB)\n",(double)iVar1 / 1024.0);
  local_660 = 0;
  cNetName[0x1fc] = '\0';
  cNetName[0x1fd] = '\0';
  cNetName[0x1fe] = '\0';
  cNetName[0x1ff] = '\0';
  for (; (int)cNetName._508_4_ < this->m_iNumNet; cNetName._508_4_ = cNetName._508_4_ + 1) {
    do {
      pcVar9 = fgets((char *)&pInput_File,0x200,pFVar7);
      if (pcVar9 == (char *)0x0) break;
    } while (((char)pInput_File == '#') || (sVar8 = strlen((char *)&pInput_File), sVar8 < 2));
    pcVar9 = strtok((char *)&pInput_File," \t\n");
    sprintf((char *)&iNumPin,pcVar9);
    pcVar9 = strtok((char *)0x0," \t\n");
    uVar3 = atoi(pcVar9);
    pcVar9 = strtok((char *)0x0," \t\n");
    local_870 = atoi(pcVar9);
    pcVar9 = strtok((char *)0x0," \t\n");
    if (pcVar9 != (char *)0x0) {
      atoi(pcVar9);
    }
    pCVar13 = (CNet *)operator_new(0x68);
    CNet::CNet(pCVar13);
    this->m_ppNet[local_660] = pCVar13;
    if (this->m_ppNet[local_660] == (CNet *)0x0) {
      __assert_fail("m_ppNet[iNetIndex]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x30c,"virtual int CDesign::Initialize(char *)");
    }
    pCVar13 = GetNet(this,local_660);
    (*(pCVar13->super_CObject)._vptr_CObject[3])(pCVar13,(ulong)uVar3,this);
    if (1000 < (int)local_870) {
      CObject::Display(3,"net (%s) with too many pins (%d) will be ignored\n",&iNumPin,
                       (ulong)local_870);
      for (PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < (int)local_870;
          PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        do {
          pcVar9 = fgets((char *)&pInput_File,0x200,pFVar7);
          if (pcVar9 == (char *)0x0) break;
        } while (((char)pInput_File == '#') || (sVar8 = strlen((char *)&pInput_File), sVar8 < 2));
      }
      local_870 = 0;
    }
    std::vector<CPin_*,_std::allocator<CPin_*>_>::vector
              ((vector<CPin_*,_std::allocator<CPin_*>_> *)&iRX);
    for (iRY = 0; iRY < (int)local_870; iRY = iRY + 1) {
      do {
        pcVar9 = fgets((char *)&pInput_File,0x200,pFVar7);
        if (pcVar9 == (char *)0x0) break;
      } while (((char)pInput_File == '#') || (sVar8 = strlen((char *)&pInput_File), sVar8 < 2));
      pcVar9 = strtok((char *)&pInput_File," \t\n");
      iX = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      iY = atoi(pcVar9);
      iZ = (iX - this->m_iLowX) / this->m_iGridX;
      pPin._4_4_ = (iY - this->m_iLowY) / this->m_iGridY;
      pPin._0_4_ = 1;
      pcVar9 = strtok((char *)0x0," \t\n");
      if (pcVar9 != (char *)0x0) {
        pPin._0_4_ = atoi(pcVar9);
      }
      pCStack_8d8 = (CPoint *)0x0;
      for (pCurPin._4_4_ = 0;
          sVar14 = std::vector<CPin_*,_std::allocator<CPin_*>_>::size
                             ((vector<CPin_*,_std::allocator<CPin_*>_> *)&iRX),
          (ulong)(long)pCurPin._4_4_ < sVar14 && pCStack_8d8 == (CPoint *)0x0;
          pCurPin._4_4_ = pCurPin._4_4_ + 1) {
        ppCVar15 = std::vector<CPin_*,_std::allocator<CPin_*>_>::operator[]
                             ((vector<CPin_*,_std::allocator<CPin_*>_> *)&iRX,(long)pCurPin._4_4_);
        pCVar16 = &(*ppCVar15)->super_CPoint;
        iVar1 = CPoint::X(pCVar16);
        if ((iVar1 == iZ) && (uVar3 = CPoint::Y(pCVar16), uVar3 == pPin._4_4_)) {
          pCStack_8d8 = pCVar16;
        }
      }
      if (pCStack_8d8 == (CPoint *)0x0) {
        pCVar16 = (CPoint *)operator_new(0x28);
        CPin::CPin((CPin *)pCVar16);
        pCStack_8d8 = pCVar16;
        sVar14 = std::vector<CPin_*,_std::allocator<CPin_*>_>::size
                           ((vector<CPin_*,_std::allocator<CPin_*>_> *)&iRX);
        (*(pCVar16->super_CObject)._vptr_CObject[4])
                  (pCVar16,sVar14 & 0xffffffff,(ulong)(uint)iZ,(ulong)pPin._4_4_,(ulong)(uint)pPin,
                   pCVar13);
        std::vector<CPin_*,_std::allocator<CPin_*>_>::push_back
                  ((vector<CPin_*,_std::allocator<CPin_*>_> *)&iRX,
                   (value_type *)&stack0xfffffffffffff728);
      }
    }
    CNet::AddPin(pCVar13,(vector<CPin_*,_std::allocator<CPin_*>_> *)&iRX);
    if (this->IsLUTup == 0) {
      while ((pcVar9 = fgets((char *)&pInput_File,0x200,(FILE *)cCmd._504_8_), pcVar9 != (char *)0x0
             && ((char)pInput_File != '!'))) {
        if (((char)pInput_File != '#') && (sVar8 = strlen((char *)&pInput_File), 1 < sVar8)) {
          strtok((char *)&pInput_File," \t\n");
          pcVar9 = strtok((char *)0x0," \t\n");
          atoi(pcVar9);
          pcVar9 = strtok((char *)0x0," \t\n");
          iVar1 = atoi(pcVar9);
          for (pWire_1._4_4_ = 0; pWire_1._4_4_ < iVar1; pWire_1._4_4_ = pWire_1._4_4_ + 1) {
            do {
              pcVar9 = fgets((char *)&pInput_File,0x200,(FILE *)cCmd._504_8_);
              if (pcVar9 == (char *)0x0) break;
            } while (((char)pInput_File == '#') || (sVar8 = strlen((char *)&pInput_File), sVar8 < 2)
                    );
            iVar2 = CNet::GetNumPin(pCVar13);
            if (1 < iVar2) {
              pCVar18 = CWire::New();
              if (pCVar18 == (CWire *)0x0) {
                __assert_fail("pWire",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                              ,0x3a7,"virtual int CDesign::Initialize(char *)");
              }
              pcVar9 = strtok((char *)&pInput_File," \t\n");
              iVar2 = atoi(pcVar9);
              pcVar9 = strtok((char *)0x0," \t\n");
              iVar4 = atoi(pcVar9);
              strtok((char *)0x0," \t\n");
              pcVar9 = strtok((char *)0x0," \t\n");
              iVar5 = atoi(pcVar9);
              pcVar9 = strtok((char *)0x0," \t\n");
              iY_00 = atoi(pcVar9);
              pCVar16 = &CNet::GetPin(pCVar13,iVar2,iVar4)->super_CPoint;
              pCVar19 = &CNet::GetPin(pCVar13,iVar5,iY_00)->super_CPoint;
              if (pCVar16 == (CPoint *)0x0) {
                local_b88 = GetRoutableLayer(this,0x80);
              }
              else {
                local_b88 = CPoint::Z(pCVar16);
              }
              if (pCVar19 == (CPoint *)0x0) {
                local_b98 = GetRoutableLayer(this,0x80);
              }
              else {
                local_b98 = CPoint::Z(pCVar19);
              }
              if (local_b98 < local_b88) {
                if (pCVar16 == (CPoint *)0x0) {
                  local_ba4 = GetRoutableLayer(this,0x80);
                }
                else {
                  local_ba4 = CPoint::Z(pCVar16);
                }
                local_bac = local_ba4;
              }
              else {
                if (pCVar19 == (CPoint *)0x0) {
                  local_bb4 = GetRoutableLayer(this,0x80);
                }
                else {
                  local_bb4 = CPoint::Z(pCVar19);
                }
                local_bac = local_bb4;
              }
              CWire::Initialize(pCVar18,iVar2,iVar4,iVar5,iY_00,local_bac);
              CNet::AddWire(pCVar13,pCVar18);
            }
          }
        }
      }
    }
    else {
      iVar1 = CNet::GetNumPin(pCVar13);
      if (iVar1 < 2) {
        if (cCmd._504_8_ != 0) {
          uVar17 = CObject::GetKey(&pCVar13->super_CObject);
          fprintf((FILE *)cCmd._504_8_,"%s %d %d\n!\n",&iNumPin,uVar17 & 0xffffffff,0);
        }
      }
      else {
        for (FluteTree.branch._4_4_ = 0; iVar1 = CNet::GetNumPin(pCVar13),
            FluteTree.branch._4_4_ < iVar1; FluteTree.branch._4_4_ = FluteTree.branch._4_4_ + 1) {
          pCVar16 = &CNet::GetPin(pCVar13,FluteTree.branch._4_4_)->super_CPoint;
          iVar1 = CPoint::X(pCVar16);
          Initialize::iArrX[FluteTree.branch._4_4_] = iVar1;
          pCVar16 = &CNet::GetPin(pCVar13,FluteTree.branch._4_4_)->super_CPoint;
          iVar1 = CPoint::Y(pCVar16);
          Initialize::iArrY[FluteTree.branch._4_4_] = iVar1;
        }
        iVar1 = CNet::GetNumPin(pCVar13);
        if (iVar1 < 10) {
          iVar1 = CNet::GetNumPin(pCVar13);
          TVar21 = flute(iVar1,Initialize::iArrX,Initialize::iArrY,3);
        }
        else {
          iVar1 = CNet::GetNumPin(pCVar13);
          TVar21 = flute(iVar1,Initialize::iArrX,Initialize::iArrY,0x1c);
        }
        FluteTree._0_8_ = TVar21.branch;
        iNeighbor = 0;
        for (j_4 = 0; local_900 = TVar21.deg, j_4 < local_900 * 2 + -2; j_4 = j_4 + 1) {
          iVar1 = *(int *)(FluteTree._0_8_ + (long)j_4 * 0xc + 8);
          if ((iVar1 != j_4) &&
             ((*(int *)(FluteTree._0_8_ + (long)j_4 * 0xc) !=
               *(int *)(FluteTree._0_8_ + (long)iVar1 * 0xc) ||
              (*(int *)(FluteTree._0_8_ + (long)j_4 * 0xc + 4) !=
               *(int *)(FluteTree._0_8_ + (long)iVar1 * 0xc + 4))))) {
            iNeighbor = iNeighbor + 1;
          }
        }
        if (cCmd._504_8_ != 0) {
          uVar17 = CObject::GetKey(&pCVar13->super_CObject);
          fprintf((FILE *)cCmd._504_8_,"%s %d %d\n",&iNumPin,uVar17 & 0xffffffff,
                  (ulong)(uint)iNeighbor);
        }
        for (local_930 = 0; local_930 < local_900 * 2 + -2; local_930 = local_930 + 1) {
          iVar1 = *(int *)(FluteTree._0_8_ + (long)local_930 * 0xc + 8);
          if ((iVar1 != local_930) &&
             ((*(int *)(FluteTree._0_8_ + (long)local_930 * 0xc) !=
               *(int *)(FluteTree._0_8_ + (long)iVar1 * 0xc) ||
              (*(int *)(FluteTree._0_8_ + (long)local_930 * 0xc + 4) !=
               *(int *)(FluteTree._0_8_ + (long)iVar1 * 0xc + 4))))) {
            if (cCmd._504_8_ != 0) {
              fprintf((FILE *)cCmd._504_8_,"%d %d - %d %d\n",
                      (ulong)*(uint *)(FluteTree._0_8_ + (long)local_930 * 0xc),
                      (ulong)*(uint *)(FluteTree._0_8_ + (long)local_930 * 0xc + 4),
                      (ulong)*(uint *)(FluteTree._0_8_ + (long)iVar1 * 0xc),
                      (ulong)*(uint *)(FluteTree._0_8_ + (long)iVar1 * 0xc + 4));
            }
            pCVar18 = CWire::New();
            if (pCVar18 == (CWire *)0x0) {
              __assert_fail("pWire",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                            ,0x37b,"virtual int CDesign::Initialize(char *)");
            }
            iVar2 = *(int *)(FluteTree._0_8_ + (long)local_930 * 0xc);
            iVar4 = *(int *)(FluteTree._0_8_ + 4 + (long)local_930 * 0xc);
            iVar5 = *(int *)(FluteTree._0_8_ + (long)iVar1 * 0xc);
            iVar1 = *(int *)(FluteTree._0_8_ + 4 + (long)iVar1 * 0xc);
            pCVar16 = &CNet::GetPin(pCVar13,iVar2,iVar4)->super_CPoint;
            pCVar19 = &CNet::GetPin(pCVar13,iVar5,iVar1)->super_CPoint;
            if (pCVar16 == (CPoint *)0x0) {
              local_b10 = GetRoutableLayer(this,0x80);
            }
            else {
              local_b10 = CPoint::Z(pCVar16);
            }
            if (pCVar19 == (CPoint *)0x0) {
              local_b20 = GetRoutableLayer(this,0x80);
            }
            else {
              local_b20 = CPoint::Z(pCVar19);
            }
            if (local_b20 < local_b10) {
              if (pCVar16 == (CPoint *)0x0) {
                local_b2c = GetRoutableLayer(this,0x80);
              }
              else {
                local_b2c = CPoint::Z(pCVar16);
              }
              local_b34 = local_b2c;
            }
            else {
              if (pCVar19 == (CPoint *)0x0) {
                local_b3c = GetRoutableLayer(this,0x80);
              }
              else {
                local_b3c = CPoint::Z(pCVar19);
              }
              local_b34 = local_b3c;
            }
            CWire::Initialize(pCVar18,iVar2,iVar4,iVar5,iVar1,local_b34);
            CNet::AddWire(pCVar13,pCVar18);
          }
        }
        if (cCmd._504_8_ != 0) {
          fprintf((FILE *)cCmd._504_8_,"!\n");
        }
        fflush((FILE *)cCmd._504_8_);
      }
    }
    iVar1 = CNet::IsLocal(pCVar13);
    if (iVar1 == 0) {
      iVar1 = CNet::GetNumWire(pCVar13,1,3);
      if (iVar1 == 0) {
        CObject::Display(1,"net %s should have at least one wire\n",&iNumPin);
      }
      iVar1 = CNet::GetLength(pCVar13,1,2);
      pCVar13->m_iMinWL = iVar1;
      local_660 = local_660 + 1;
    }
    else {
      if (pCVar13 != this->m_ppNet[local_660]) {
        __assert_fail("pNet==m_ppNet[iNetIndex]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x3bd,"virtual int CDesign::Initialize(char *)");
      }
      if (this->m_ppNet[local_660] != (CNet *)0x0) {
        if (this->m_ppNet[local_660] != (CNet *)0x0) {
          (*(this->m_ppNet[local_660]->super_CObject)._vptr_CObject[1])();
        }
        this->m_ppNet[local_660] = (CNet *)0x0;
      }
      this->m_iNumLocalNet = this->m_iNumLocalNet + 1;
    }
    std::vector<CPin_*,_std::allocator<CPin_*>_>::~vector
              ((vector<CPin_*,_std::allocator<CPin_*>_> *)&iRX);
  }
  CreateNet(this,local_660);
  do {
    pcVar9 = fgets((char *)&pInput_File,0x200,pFVar7);
    if (pcVar9 == (char *)0x0) goto LAB_0010acbd;
  } while (((char)pInput_File == '#') || (sVar8 = strlen((char *)&pInput_File), sVar8 < 2));
  uVar3 = atoi((char *)&pInput_File);
  if (uVar3 != 0) {
    CObject::Display(0,"%d blocakges are specified\n",(ulong)uVar3);
    for (iY1_2 = 0; iY1_2 < (int)uVar3; iY1_2 = iY1_2 + 1) {
      do {
        pcVar9 = fgets((char *)&pInput_File,0x200,pFVar7);
        if (pcVar9 == (char *)0x0) break;
      } while (((char)pInput_File == '#') || (sVar8 = strlen((char *)&pInput_File), sVar8 < 2));
      pcVar9 = strtok((char *)&pInput_File," \t\n");
      iX1_00 = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      iY1_00 = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      iLayer = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      iX2_00 = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      iY2_00 = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      uVar6 = atoi(pcVar9);
      if (iLayer != uVar6) {
        __assert_fail("iZ1==iZ2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x3f0,"virtual int CDesign::Initialize(char *)");
      }
      if (iX1_00 != iX2_00 && iY1_00 != iY2_00) {
        __assert_fail("iX1==iX2||iY1==iY2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x3f1,"virtual int CDesign::Initialize(char *)");
      }
      if ((int)(iX1_00 - iX2_00) < 0) {
        local_bd8 = -(iX1_00 - iX2_00);
      }
      else {
        local_bd8 = iX1_00 - iX2_00;
      }
      bVar20 = true;
      if (local_bd8 != 1) {
        if ((int)(iY1_00 - iY2_00) < 0) {
          local_be0 = -(iY1_00 - iY2_00);
        }
        else {
          local_be0 = iY1_00 - iY2_00;
        }
        bVar20 = local_be0 == 1;
      }
      if (!bVar20) {
        __assert_fail("abs((iX1-iX2))==1||abs((iY1-iY2))==1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x3f2,"virtual int CDesign::Initialize(char *)");
      }
      pCVar11 = GetLayer(this,iLayer);
      this_01 = CLayer::GetBoundary(pCVar11,iX1_00,iY1_00,iX2_00,iY2_00);
      if (this_01 == (CBoundary *)0x0) {
        in_stack_fffffffffffff400 =
             (CDesign *)CONCAT44((int)((ulong)in_stack_fffffffffffff400 >> 0x20),uVar6);
        CObject::Display(1,"boundary (%d,%d,%d)-(%d,%d,%d) not found\n",(ulong)iX1_00,(ulong)iY1_00,
                         (ulong)iLayer,(ulong)iX2_00,iY2_00,in_stack_fffffffffffff400);
      }
      if (*(short *)&(this_01->super_CPoint).field_0x26 != 0) {
        in_stack_fffffffffffff400 =
             (CDesign *)CONCAT44((int)((ulong)in_stack_fffffffffffff400 >> 0x20),uVar6);
        CObject::Display(1,"boundary (%d,%d,%d)-(%d,%d,%d) is overwritten\n",(ulong)iX1_00,
                         (ulong)iY1_00,(ulong)iLayer,(ulong)iX2_00,iY2_00,in_stack_fffffffffffff400)
        ;
      }
      pCVar11 = CBoundary::GetParent(this_01);
      iVar1 = CLayer::GetCapacity(pCVar11,0x40);
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar2 = atoi(pcVar9);
      this->m_iNumBCap = (iVar1 - iVar2) + this->m_iNumBCap;
      CBoundary::AdjustCapacity(this_01,iVar1 - iVar2);
    }
    uVar3 = GetCapacity(this,0x1000);
    CObject::Display(0,"total available capacity: %d\n",(ulong)uVar3);
  }
LAB_0010acbd:
  if (pFVar7 != (FILE *)0x0) {
    fclose(pFVar7);
  }
  if (cCmd._504_8_ != 0) {
    fclose((FILE *)cCmd._504_8_);
  }
  uVar3 = GetNumNet(this,1,3);
  iVar1 = GetMemory();
  CObject::Display(0,"input [%s with %d nets] is loaded (%.1f MB)\n",(double)iVar1 / 1024.0,
                   &this->field_0x234,(ulong)uVar3);
  sVar8 = strlen(&this->field_0x834);
  if ((sVar8 != 0) && (pFVar7 = fopen(&this->field_0x834,"rt"), pFVar7 != (FILE *)0x0)) {
    if (pFVar7 != (FILE *)0x0) {
      fclose(pFVar7);
    }
    *(uint *)&this->field_0xc50 = *(uint *)&this->field_0xc50 & 0xfffffffc;
  }
  if (*(int *)&this->field_0xc54 < 0) {
    iVar1 = CBBox::W(&this->super_CBBox);
    iVar2 = CBBox::H(&this->super_CBBox);
    if (iVar2 < iVar1) {
      local_bf8 = CBBox::W(&this->super_CBBox);
    }
    else {
      local_bf8 = CBBox::H(&this->super_CBBox);
    }
    *(int *)&this->field_0xc54 = (int)((double)local_bf8 * 0.1);
  }
  CObject::Display(2,"mazerouting margin %d\n",(ulong)*(uint *)&this->field_0xc54);
  (*(this->super_CObject)._vptr_CObject[2])(this,stdout,0);
  return 1;
}

Assistant:

int	CDesign::Initialize(char* pName)
{
#ifdef _DEBUG
	m_iDebugNet	=	188;
#endif
	ReadParam(pName);

	//SetState(STATE_DESN_COMPLETED);
	//PrintResult();

	//vector<CGrid*>	Queue;

	//CGrid	G[4];
	//CGrid* pG[4];

	//G[0].SetMazeCostGrid(1,NULL);
	//G[1].SetMazeCostGrid(7,NULL);
	//G[2].SetMazeCostGrid(4,NULL);
	//G[3].SetMazeCostGrid(3,NULL);

	//Queue.push_back(&G[0]);

	//make_heap(Queue.begin(),Queue.end(),CGridOpMaze());

	//Queue.push_back(&G[1]);
	//Queue.push_back(&G[2]);
	//Queue.push_back(&G[3]);

	//push_heap(Queue.begin(), Queue.end(), CGridOpMaze());

	//pG[0]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[1]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[2]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[3]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();

	//G[1].SetMazeCostGrid(2,NULL);

	//push_heap(Queue.begin(), Queue.end(), CGridOpMaze());


	//pG[0]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[1]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[2]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[3]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();

	char	cName[MAX_BUFFER_STR];
	char	cLine[MAX_BUFFER_STR];

	//open log fiile
	SAFE_FCLOSE(m_pLog);
	sprintf(cName,"%s.log",m_Param.m_cInput_File);	
	m_pLog		=	fopen(cName,"wt");
	m_pDesign	=	this;

	Display(DISPLAY_MODE_INFO,"input file [%s]\n",m_Param.m_cInput_File);
	Display(DISPLAY_MODE_INFO,"tree file [%s]\n",m_Param.m_cTree_File);

	FILE*	pInput_File		=	fopen(m_Param.m_cInput_File,"rt");
	FILE*	pTree_File		=	fopen(m_Param.m_cTree_File,"rt");

	if(pTree_File==NULL)
	{
		Display(DISPLAY_MODE_INFO,"tree file will be written as ");

#ifdef WIN32

		// open in write mode [1/31/2007 thyeros]
		pTree_File		=	fopen(m_Param.m_cTree_File,"wt");
		readLUT();
#else
		
		char	cCmd[MAX_BUFFER_STR];

		//if(STRICMP(m_Param.m_cTree_File,"flute")==0 )
		//{
			// open in write mode [1/31/2007 thyeros]
		  	if(strlen(m_Param.m_cTree_File)==0)
			  {
			    sprintf(m_Param.m_cTree_File,"%s.stt",m_Param.m_cInput_File);
			  }

			Display(DISPLAY_MODE_NONE,"%s",m_Param.m_cTree_File);


			pTree_File		=	fopen(m_Param.m_cTree_File,"wt");
			readLUT(); // Before use flute you must init it. Need LUT Data files(provided by flute).

			Display(DISPLAY_MODE_INFO,"building steiner tree by *pure flute\n");
			//}

		/*
		else
		{

			if(strlen(m_Param.m_cTree_File)==0)
			{
				sprintf(m_Param.m_cTree_File,"%s.stt",m_Param.m_cInput_File);
			}

			Display(DISPLAY_MODE_NONE,"%s\n",m_Param.m_cTree_File);

			sprintf(cCmd,"./cflute.x -bt %s %s 1.0 > /tmp/stt",m_Param.m_cInput_File,m_Param.m_cTree_File);
			Display(DISPLAY_MODE_EXEC,"%s\n",cCmd);
			Display(DISPLAY_MODE_INFO,"building steiner tree in %s...",m_Param.m_cTree_File);
			Display(DISPLAY_MODE_NONE,"done (%d)!\n",system(cCmd));

			pTree_File		=	fopen(m_Param.m_cTree_File,"rt");
		}
		*/
#endif

	}else{
		IsLUTup=1;
	}

    // Read basic param of input data.
	while (fgets(cLine,sizeof(cLine),pInput_File))
	{
		if(cLine[0]=='#')	continue;
		if(strlen(cLine)<2)	continue;

		char*	pToken	=	strtok(cLine," \t\n");

		if(STRICMP(pToken,"grid")==0)
		{
			m_iSizeX		=	atoi(strtok(NULL," \t\n"));
			m_iSizeY		=	atoi(strtok(NULL," \t\n"));

			pToken			=	strtok(NULL," \t\n");
			if(pToken)	m_iSizeZ	=	max(2,atoi(pToken));		// multilayer routing [1/31/2007 thyeros]
			else		m_iSizeZ	=	2;							// planar routing [1/31/2007 thyeros]

            ///@sa CBBox::Initialize()
			CBBox::Initialize(0,0,0,m_iSizeX,m_iSizeY,m_iSizeZ);

            ///@sa CreateLayer()
			CreateLayer();
		}
		else if(STRICMP(pToken,"vertical")==0&&strtok(NULL," \t\n"))
		{
			int	iIndex	=	LAYER_METAL1;	
			for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"))
			{
				int	iCapacity	=	atoi(pToken);
				if(iCapacity)
				{
					for(;GetLayer(iIndex)->GetKey();iIndex++);	
                    ///@sa CLayer::Configure()
					GetLayer(iIndex)->Configure(iIndex,iCapacity,DIR_VERTICAL,0,0,0,this);
				}

				++iIndex;
			}
		}
		else if(STRICMP(pToken,"horizontal")==0&&strtok(NULL," \t\n"))
		{
			int	iIndex	=	LAYER_METAL1;	
			for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"))
			{
				int	iCapacity	=	atoi(pToken);
				if(iCapacity)
				{
					for(;GetLayer(iIndex)->GetKey();iIndex++);
					GetLayer(iIndex)->Configure(iIndex,iCapacity,DIR_HORIZONTAL,0,0,0,this);
				}

				++iIndex;
			}
		}
		else if(STRICMP(pToken,"minimum")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"width")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,atoi(pToken),-1,-1,this);
				}

			}
			else if(STRICMP(pToken,"spacing")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,-1,atoi(pToken),-1,this);
				}
			}
		}
		else if(STRICMP(pToken,"via")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"spacing")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,-1,-1,atoi(pToken),this);
				}
			}
		}
		else if(STRICMP(pToken,"num")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"net")==0)
			{
                ///@sa CreatNet()
				CreateNet(atoi(strtok(NULL," \t\n")));

				for (int i=LAYER_METAL1;i<=T();++i)	
				{
					CLayer*	pLayer	=	GetLayer(i);

					if(!pLayer->GetKey())
					{
						int	iDirection	=	-1;

						if(i==LAYER_METAL1)										iDirection	=	DIR_VERTICAL;
						else if(GetLayer(i-1)->GetDirection()==DIR_VERTICAL)	iDirection	=	DIR_HORIZONTAL;
						else													iDirection	=	DIR_VERTICAL;

						pLayer->Configure(i,0,iDirection,0,0,0,this);
					}

                    ///@sa CLayer::Initialize()
					pLayer->Initialize();
					m_iMaxCapacity		=	MAX(m_iMaxCapacity,pLayer->GetCapacity(GET_MODE_MAX));
				}

				///@sa SetHighestRoutableLayer()
				SetHighestRoutableLayer(T());
				///@sa SetLowestRoutableLayer()
				SetLowestRoutableLayer(LAYER_METAL1);

				break;
			}
		}
		else
		{
			m_iLowX		=	atoi(pToken);
			m_iLowY		=	atoi(strtok(NULL," \t\n"));
			m_iGridX	=	atoi(strtok(NULL," \t\n"));
			m_iGridY	=	atoi(strtok(NULL," \t\n"));
		}
	}

	Display(DISPLAY_MODE_INFO,"total available capacity: %d\n",GetCapacity(GET_MODE_ACAP));
	Display(DISPLAY_MODE_INFO,"reading nets started (%.1f MB)\n",GetMemory()/1024.0);

	//////////////////////////////////////////////////////////////////////////
	// start read nets [1/31/2007 thyeros]
	//////////////////////////////////////////////////////////////////////////
	int	iNetIndex	=	0;
	for(int i=0;i<m_iNumNet;++i)
	{
		while(fgets(cLine,sizeof(cLine),pInput_File))
		{
			if(cLine[0]=='#')	continue;
			if(strlen(cLine)<2)	continue;
			break;
		}

		char	cNetName[MAX_BUFFER_STR];
		sprintf(cNetName,strtok(cLine," \t\n"));
		int		iNetID	 		=	atoi(strtok(NULL," \t\n"));
		int		iNumPin			=	atoi(strtok(NULL," \t\n"));
		int		iWidth			=	1;

		char*	pToken			=	strtok(NULL," \t\n");
		if(pToken)	iWidth		=	atoi(pToken);	

		m_ppNet[iNetIndex]		=	new	CNet;
		assert(m_ppNet[iNetIndex]);

		CNet*	pNet			=	GetNet(iNetIndex);
        ///@sa CNet
		pNet->Initialize(iNetID,/*iWidth,*/this);

		if(iNumPin>1000)
		{
			Display(DISPLAY_MODE_WARN,"net (%s) with too many pins (%d) will be ignored\n",cNetName,iNumPin);

			for(int j=0;j<iNumPin;++j)
			{
				while(fgets(cLine,sizeof(cLine),pInput_File))
				{
					if(cLine[0]=='#')	continue;
					if(strlen(cLine)<2)	continue;
					break;
				}
			}

			iNumPin	=	0;
		}

		// get pins [1/31/2007 thyeros]
		vector<CPin*>	PinList;
		for(int j=0;j<iNumPin;++j)
		{
			while(fgets(cLine,sizeof(cLine),pInput_File))
			{
				if(cLine[0]=='#')	continue;
				if(strlen(cLine)<2)	continue;
				break;
			}

			// this is the real location [1/31/2007 thyeros]
			int	iRX				=	atoi(strtok(cLine," \t\n"));
			int	iRY				=	atoi(strtok(NULL," \t\n"));
			int	iX				=	(iRX-m_iLowX)/m_iGridX;
			int	iY				=	(iRY-m_iLowY)/m_iGridY;
			int	iZ				=	LAYER_METAL1;

			pToken				=	strtok(NULL," \t\n");
			if(pToken)	iZ		=	atoi(pToken);

			CPin*		pPin	=	NULL;

			for(int k=0;k<PinList.size()&&!pPin;k++)
			{
				CPin*	pCurPin	=	PinList[k];

				if(pCurPin->X()==iX&&pCurPin->Y()==iY)	pPin		=	pCurPin;
			}

			if(pPin==NULL)
			{
				pPin	=	new	CPin;
				pPin->Initialize(PinList.size(),iX,iY,iZ,pNet);
				PinList.push_back(pPin);
			}
		}

		pNet->AddPin(&PinList);
//		pNet->m_iMinVia	+=	PinList.size();

		if(IsLUTup)
		{
			if(pNet->GetNumPin()<2)
			{
				if(pTree_File) fprintf(pTree_File,"%s %d %d\n!\n",cNetName,(int)pNet->GetKey(),0);
			}
			else
			{
				// create and save a tree topolgy [1/31/2007 thyeros]
				static int iArrX[MAX_BUFFER];
				static int iArrY[MAX_BUFFER];

				for(int j=0;j<pNet->GetNumPin();++j)
				{
					iArrX[j]	=	pNet->GetPin(j)->X();
					iArrY[j]	=	pNet->GetPin(j)->Y();
				}			

				Tree FluteTree;

				if(pNet->GetNumPin()<=9)	FluteTree = flute(pNet->GetNumPin(),iArrX,iArrY,ACCURACY);
				else						FluteTree = flute(pNet->GetNumPin(),iArrX,iArrY,ACCURACY+25);

				int	iNumWire	=	0;
				for(int j=0;j<2*FluteTree.deg-2;++j) 
				{
					int     iNeighbor = FluteTree.branch[j].n;

					if(iNeighbor==j)        continue;
					if(FluteTree.branch[j].x==FluteTree.branch[iNeighbor].x&&FluteTree.branch[j].y==FluteTree.branch[iNeighbor].y)   continue;

					++iNumWire;
				}  

				if(pTree_File) fprintf(pTree_File,"%s %d %d\n",cNetName,(int)pNet->GetKey(),iNumWire);
				for(int j=0;j<2*FluteTree.deg-2;++j) 
				{
					int     iNeighbor = FluteTree.branch[j].n;

					if(iNeighbor==j)        continue;
					if(FluteTree.branch[j].x==FluteTree.branch[iNeighbor].x&&FluteTree.branch[j].y==FluteTree.branch[iNeighbor].y)   continue;

					if(pTree_File) fprintf(pTree_File,"%d %d - %d %d\n",  FluteTree.branch[j].x,FluteTree.branch[j].y,FluteTree.branch[iNeighbor].x,FluteTree.branch[iNeighbor].y);

					CWire*	pWire	=	CWire::New();//new	CWire;


					assert(pWire);

					int	iX1			=	FluteTree.branch[j].x;
					int	iY1			=	FluteTree.branch[j].y;
					int	iX2			=	FluteTree.branch[iNeighbor].x;
					int	iY2			=	FluteTree.branch[iNeighbor].y;

					CPin*	pPin1	=	pNet->GetPin(iX1,iY1);
					CPin*	pPin2	=	pNet->GetPin(iX2,iY2);
					int	iZ			=	MAX(pPin1? pPin1->Z():GetRoutableLayer(GET_MODE_MIN),pPin2? pPin2->Z():GetRoutableLayer(GET_MODE_MIN));

					pWire->Initialize(iX1,iY1,iX2,iY2,iZ);
					pNet->AddWire(pWire);
//					pNet->m_iMinVia	+=	(2-pWire->GetNumPinOn()+pWire->IsFlat()? 0:1);			
				}
				if(pTree_File) fprintf(pTree_File,"!\n");fflush(pTree_File);
			}
		}
		else
		{
			// read the tree toplogy [1/31/2007 thyeros]
			while(fgets(cLine,sizeof(cLine),pTree_File))
			{
				if(cLine[0]=='!')	break;
				if(cLine[0]=='#')	continue;
				if(strlen(cLine)<2)	continue;

				char*	pName			=	strtok(cLine," \t\n");
				int		iNetIndex 		=	atoi(strtok(NULL," \t\n"));
				int		iNumWire		=	atoi(strtok(NULL," \t\n"));

				for(int j=0;j<iNumWire;++j)
				{
					while(fgets(cLine,sizeof(cLine),pTree_File))
					{
						if(cLine[0]=='#')	continue;
						if(strlen(cLine)<2)	continue;
						break;
					}

					// larget nets with over 1000pins have ZERO pins [2/20/2007 thyeros]
					if(pNet->GetNumPin()>=2)
					{
						CWire*	pWire	=	CWire::New();//new	CWire;
						assert(pWire);

						int	iX1			=	atoi(strtok(cLine," \t\n"));
						int	iY1			=	atoi(strtok(NULL," \t\n"));
						strtok(NULL," \t\n");	//thyeros- dash.. [6/16/2006]
						int	iX2			=	atoi(strtok(NULL," \t\n"));
						int	iY2			=	atoi(strtok(NULL," \t\n"));

						CPin*	pPin1	=	pNet->GetPin(iX1,iY1);
						CPin*	pPin2	=	pNet->GetPin(iX2,iY2);
						int	iZ			=	MAX(pPin1? pPin1->Z():GetRoutableLayer(GET_MODE_MIN),pPin2? pPin2->Z():GetRoutableLayer(GET_MODE_MIN));

						pWire->Initialize(iX1,iY1,iX2,iY2,iZ);
						pNet->AddWire(pWire);
//						pNet->m_iMinVia	+=	(2-pWire->GetNumPinOn()+pWire->IsFlat()? 0:1);			
					}
				}				
			}
		}

		if(pNet->IsLocal())
		{
			assert(pNet==m_ppNet[iNetIndex]);

			SAFE_DEL(m_ppNet[iNetIndex]);
			++m_iNumLocalNet;
		}
		else
		{
			if(pNet->GetNumWire()==0)	Display(DISPLAY_MODE_ERRO,"net %s should have at least one wire\n",cNetName);
			pNet->m_iMinWL	=	pNet->GetLength(GET_MODE_STATE,STATE_WIRE_UNROUTED);
			++iNetIndex;
		}
	}

	// save some memory by removing local nets [2/13/2007 thyeros]
	CreateNet(iNetIndex);

	//////////////////////////////////////////////////////////////////////////
	// read speical net/blockages [1/31/2007 thyeros]
	//////////////////////////////////////////////////////////////////////////
	while(fgets(cLine,sizeof(cLine),pInput_File))
	{
		//// temporarily ignore blocakges  [2/27/2007 thyeros]
		//Display(DISPLAY_MODE_WARN,"blockages are ignored for test purpose!\n");
		//break;

		if(cLine[0]=='#')	continue;
		if(strlen(cLine)<2)	continue;

		int	iNumBlock	=	atoi(cLine);

		if(iNumBlock)
		{
			Display(DISPLAY_MODE_INFO,"%d blocakges are specified\n",iNumBlock);

			for(int i=0;i<iNumBlock;++i)
			{
				while(fgets(cLine,sizeof(cLine),pInput_File))
				{
					if(cLine[0]=='#')	continue;
					if(strlen(cLine)<2)	continue;
					break;
				}

				int	iX1		=	atoi(strtok(cLine," \t\n"));
				int	iY1		=	atoi(strtok(NULL," \t\n"));
				int	iZ1		=	atoi(strtok(NULL," \t\n"));

				int	iX2		=	atoi(strtok(NULL," \t\n"));
				int	iY2		=	atoi(strtok(NULL," \t\n"));
				int	iZ2		=	atoi(strtok(NULL," \t\n"));

				assert(iZ1==iZ2);
				assert(iX1==iX2||iY1==iY2);
				assert(abs((iX1-iX2))==1||abs((iY1-iY2))==1);

				CBoundary*	pBoundary	=	GetLayer(iZ1)->GetBoundary(iX1,iY1,iX2,iY2);

				if(!pBoundary)				Display(DISPLAY_MODE_ERRO,"boundary (%d,%d,%d)-(%d,%d,%d) not found\n",iX1,iY1,iZ1,iX2,iY2,iZ2);
				if(pBoundary->m_iNumOCap)	Display(DISPLAY_MODE_ERRO,"boundary (%d,%d,%d)-(%d,%d,%d) is overwritten\n",iX1,iY1,iZ1,iX2,iY2,iZ2);

				int	iBlockage	=	pBoundary->GetParent()->GetCapacity(GET_MODE_MAX)-atoi(strtok(NULL," \t\n"));
				m_iNumBCap	+=		iBlockage;
				pBoundary->AdjustCapacity(iBlockage);
			}
			Display(DISPLAY_MODE_INFO,"total available capacity: %d\n",GetCapacity(GET_MODE_ACAP));
		}

		break;
	}

	SAFE_FCLOSE(pInput_File);
	SAFE_FCLOSE(pTree_File);

	Display(DISPLAY_MODE_INFO,"input [%s with %d nets] is loaded (%.1f MB)\n",m_Param.m_cInput_File,GetNumNet(),GetMemory()/1024.0);

	if(strlen(m_Param.m_cDump_File))
	{
		FILE*	pDumpFile	=	fopen(m_Param.m_cDump_File,"rt");
		if(pDumpFile)
		{
			SAFE_FCLOSE(pDumpFile);
			m_Param.m_iProperty	&=	~(PROP_PARAM_PRER|PROP_PARAM_BOXR);
		}
	}

	if(m_Param.m_iMazeRouting_Margin<0)	m_Param.m_iMazeRouting_Margin	=	0.1*MAX(W(),H());
	Display(DISPLAY_MODE_PARM,"mazerouting margin %d\n",m_Param.m_iMazeRouting_Margin);

	Print(stdout,PRINT_MODE_TEXT);

	return	TRUE;
}